

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_279991::LaneBasedExecutionQueue::executeProcess
          (LaneBasedExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  ProcessResult __args;
  ArrayRef<llvm::StringRef> commandLine_00;
  StringRef value;
  StringRef key;
  bool bVar1;
  JobDescriptor *pJVar2;
  function<void_(llbuild::basic::ProcessResult)> *this_00;
  undefined8 uVar3;
  iterator ppVar4;
  ProcessContext *ctx;
  ProcessDelegate *local_488;
  size_t local_480;
  POSIXEnvironment local_3f8;
  StringRef *local_388;
  size_type local_380;
  ProcessHandle local_378;
  anon_class_48_2_04b92ec3 local_370;
  undefined1 local_340 [8];
  ProcessCompletionFn laneCompletionFn;
  undefined1 local_318 [8];
  ProcessReleaseFn releaseFn;
  ProcessHandle handle;
  StringRef local_2d0;
  undefined1 local_2c0 [8];
  pair<llvm::StringRef,_llvm::StringRef> pair;
  char **p;
  pair<llvm::StringRef,_llvm::StringRef> *entry;
  iterator __end2;
  iterator __begin2;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *__range2;
  string local_240;
  StringRef local_220;
  StringRef local_210;
  Twine local_200;
  string local_1e8;
  StringRef local_1c8;
  StringRef local_1b8;
  undefined1 local_1a8 [8];
  POSIXEnvironment posixEnv;
  ProcessResult local_130;
  undefined1 local_108 [8];
  unique_lock<std::mutex> lock;
  undefined1 local_e8 [8];
  SmallString<64U> description;
  LaneBasedExecutionQueueJobContext *context;
  QueueJobContext *opaqueContext_local;
  LaneBasedExecutionQueue *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment_local;
  ArrayRef<llvm::StringRef> commandLine_local;
  
  environment_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)environment.Length;
  this_local = (LaneBasedExecutionQueue *)environment.Data;
  environment_local.Length = (size_type)commandLine.Data;
  description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts._56_8_ =
       opaqueContext;
  llvm::SmallString<64U>::SmallString((SmallString<64U> *)local_e8);
  pJVar2 = llbuild::basic::QueueJob::getDescriptor
                     (*(QueueJob **)
                       (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>
                        .InlineElts._56_8_ + 0x18));
  (*pJVar2->_vptr_JobDescriptor[3])(pJVar2,local_e8);
  uVar3 = *(undefined8 *)
           (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts.
            _56_8_ + 0x10);
  join_0x00000010_0x00000000_ = llvm::SmallString<64U>::str((SmallString<64U> *)local_e8);
  llbuild::TracingExecutionQueueSubprocessStart((uint32_t)uVar3,join_0x00000010_0x00000000_);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_108,&this->readyJobsMutex);
  if ((this->cancelled & 1U) == 0) {
    posixEnv._108_4_ = 0;
  }
  else {
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      this_00 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                          (completionFn);
      llbuild::basic::ProcessResult::makeCancelled(&local_130,-1);
      __args.pid = local_130.pid;
      __args._12_4_ = local_130._12_4_;
      __args.status = local_130.status;
      __args.exitCode = local_130.exitCode;
      __args.utime = local_130.utime;
      __args.stime = local_130.stime;
      __args.maxrss = local_130.maxrss;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(this_00,__args);
    }
    posixEnv._108_4_ = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_108);
  if (posixEnv._108_4_ == 0) {
    llbuild::basic::POSIXEnvironment::POSIXEnvironment((POSIXEnvironment *)local_1a8);
    strlen("LLBUILD_BUILD_ID");
    llvm::Twine::Twine(&local_200,this->buildID);
    llvm::Twine::str_abi_cxx11_(&local_1e8,&local_200);
    uVar3 = std::__cxx11::string::data();
    local_1c8.Data = (char *)uVar3;
    uVar3 = std::__cxx11::string::length();
    local_1c8.Length = uVar3;
    llbuild::basic::POSIXEnvironment::setIfMissing
              ((POSIXEnvironment *)local_1a8,local_1b8,local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    strlen("LLBUILD_LANE_ID");
    llvm::Twine::Twine((Twine *)&__range2,
                       (unsigned_long *)
                       (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>
                        .InlineElts._56_8_ + 0x10));
    llvm::Twine::str_abi_cxx11_(&local_240,(Twine *)&__range2);
    uVar3 = std::__cxx11::string::data();
    local_220.Data = (char *)uVar3;
    uVar3 = std::__cxx11::string::length();
    local_220.Length = uVar3;
    llbuild::basic::POSIXEnvironment::setIfMissing
              ((POSIXEnvironment *)local_1a8,local_210,local_220);
    std::__cxx11::string::~string((string *)&local_240);
    __end2 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::begin
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)&this_local);
    ppVar4 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::end
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)&this_local);
    for (; __end2 != ppVar4; __end2 = __end2 + 1) {
      llbuild::basic::POSIXEnvironment::setIfMissing
                ((POSIXEnvironment *)local_1a8,__end2->first,__end2->second);
    }
    if (((undefined1  [32])attributes & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      for (pair.second.Length = (size_t)this->environment; *(long *)pair.second.Length != 0;
          pair.second.Length = pair.second.Length + 8) {
        local_2d0.Data = *(char **)pair.second.Length;
        if (local_2d0.Data == (char *)0x0) {
          local_480 = 0;
        }
        else {
          local_480 = strlen(local_2d0.Data);
        }
        local_2d0.Length = local_480;
        llvm::StringRef::split((pair<llvm::StringRef,_llvm::StringRef> *)local_2c0,&local_2d0,'=');
        key.Length = (size_t)pair.first.Data;
        key.Data = (char *)local_2c0;
        value.Length = (size_t)pair.second.Data;
        value.Data = (char *)pair.first.Length;
        llbuild::basic::POSIXEnvironment::setIfMissing((POSIXEnvironment *)local_1a8,key,value);
      }
    }
    releaseFn._M_invoker =
         *(_Invoker_type *)
          (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts.
           _56_8_ + 8);
    laneCompletionFn._M_invoker = (_Invoker_type)this;
    std::function<void(std::function<void()>&&)>::
    function<(anonymous_namespace)::LaneBasedExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)::_lambda(std::function<void()>&&)_1_,void>
              ((function<void(std::function<void()>&&)> *)local_318,
               (anon_class_8_1_8991fb9c *)&laneCompletionFn._M_invoker);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_370.completionFn,completionFn);
    local_370.lane =
         *(uint64_t *)
          (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts.
           _56_8_ + 0x10);
    std::function<void(llbuild::basic::ProcessResult)>::
    function<(anonymous_namespace)::LaneBasedExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)::_lambda(llbuild::basic::ProcessResult)_1_,void>
              ((function<void(llbuild::basic::ProcessResult)> *)local_340,&local_370);
    (anonymous_namespace)::LaneBasedExecutionQueue::
    executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)
    ::{lambda(llbuild::basic::ProcessResult)#1}::~ProcessDelegate
              ((_lambda_llbuild__basic__ProcessResult__1_ *)&local_370);
    if (delegate == (ProcessDelegate *)0x0) {
      local_488 = &llbuild::basic::ExecutionQueue::getDelegate(&this->super_ExecutionQueue)->
                   super_ProcessDelegate;
    }
    else {
      local_488 = delegate;
    }
    ctx = (ProcessContext *)
          llbuild::basic::QueueJob::getDescriptor
                    (*(QueueJob **)
                      (description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.
                       InlineElts._56_8_ + 0x18));
    local_378.id = (uint64_t)releaseFn._M_invoker;
    local_388 = (StringRef *)environment_local.Length;
    local_380 = commandLine.Length;
    llbuild::basic::POSIXEnvironment::POSIXEnvironment(&local_3f8,(POSIXEnvironment *)local_1a8);
    commandLine_00.Length = local_380;
    commandLine_00.Data = local_388;
    llbuild::basic::spawnProcess
              (local_488,ctx,&this->spawnedProcesses,local_378,commandLine_00,&local_3f8,attributes,
               (ProcessReleaseFn *)local_318,(ProcessCompletionFn *)local_340);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_3f8);
    std::function<void_(llbuild::basic::ProcessResult)>::~function
              ((function<void_(llbuild::basic::ProcessResult)> *)local_340);
    std::function<void_(std::function<void_()>_&&)>::~function
              ((function<void_(std::function<void_()>_&&)> *)local_318);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment((POSIXEnvironment *)local_1a8);
    posixEnv._108_4_ = 0;
  }
  llvm::SmallString<64U>::~SmallString((SmallString<64U> *)local_e8);
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    LaneBasedExecutionQueueJobContext& context =
      *reinterpret_cast<LaneBasedExecutionQueueJobContext*>(opaqueContext);

    llvm::SmallString<64> description;
    context.job.getDescriptor()->getShortDescription(description);
    TracingExecutionQueueSubprocessStart(context.laneNumber, description.str());

    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      // Do not execute new processes anymore after cancellation.
      if (cancelled) {
        if (completionFn.hasValue())
          completionFn.getValue()(ProcessResult::makeCancelled());
        return;
      }
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(context.laneNumber).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [this](std::function<void()>&& processWait) {
      auto previousTaskCount = backgroundTaskCount.fetch_add(1);
      if (previousTaskCount < backgroundTaskMax) {
        // Launch the process wait on a detached thread
        std::thread([this, processWait=std::move(processWait)]() mutable {
          processWait();
          backgroundTaskCount--;
        }).detach();
      } else {
        backgroundTaskCount--;
        // not allowed to release, call wait directly
        processWait();
      }
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn, lane=context.laneNumber](ProcessResult result) mutable {
        TracingExecutionQueueSubprocessResult(lane, result.pid, result.utime,
                                              result.stime, result.maxrss);
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }